

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_ST1_zpiz(DisasContext_conflict1 *s,arg_ST1_zpiz *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint uVar2;
  TCGv_i64 scalar;
  TCGv_i64 imm;
  gen_helper_gvec_mem_scatter *pgStack_30;
  int be;
  gen_helper_gvec_mem_scatter *fn;
  TCGContext_conflict1 *tcg_ctx;
  arg_ST1_zpiz *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  pgStack_30 = (gen_helper_gvec_mem_scatter *)0x0;
  uVar2 = (uint)(s->be_data == MO_BE);
  if (a->esz < a->msz) {
    s_local._7_1_ = false;
  }
  else {
    _Var1 = sve_access_check_aarch64(s);
    if (_Var1) {
      if (a->esz == 2) {
        pgStack_30 = scatter_store_fn32[(int)uVar2][0][a->msz];
      }
      else if (a->esz == 3) {
        pgStack_30 = *(gen_helper_gvec_mem_scatter **)
                      ((long)(int)uVar2 * 0x60 + 0x170a480 + (long)a->msz * 8);
      }
      if (pgStack_30 == (gen_helper_gvec_mem_scatter *)0x0) {
        __assert_fail("fn != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-sve.c"
                      ,0x1593,"_Bool trans_ST1_zpiz(DisasContext *, arg_ST1_zpiz *)");
      }
      scalar = tcg_const_i64_aarch64(tcg_ctx_00,(long)(a->imm << ((byte)a->msz & 0x1f)));
      do_mem_zpz(s,a->rd,a->pg,a->rn,0,scalar,a->msz,pgStack_30);
      tcg_temp_free_i64(tcg_ctx_00,scalar);
      s_local._7_1_ = true;
    }
    else {
      s_local._7_1_ = true;
    }
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_ST1_zpiz(DisasContext *s, arg_ST1_zpiz *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    gen_helper_gvec_mem_scatter *fn = NULL;
    int be = s->be_data == MO_BE;
    TCGv_i64 imm;

    if (a->esz < a->msz) {
        return false;
    }
    if (!sve_access_check(s)) {
        return true;
    }

    switch (a->esz) {
    case MO_32:
        fn = scatter_store_fn32[be][0][a->msz];
        break;
    case MO_64:
        fn = scatter_store_fn64[be][2][a->msz];
        break;
    }
    assert(fn != NULL);

    /* Treat ST1_zpiz (zn[x] + imm) the same way as ST1_zprz (rn + zm[x])
     * by loading the immediate into the scalar parameter.
     */
    imm = tcg_const_i64(tcg_ctx, a->imm << a->msz);
    do_mem_zpz(s, a->rd, a->pg, a->rn, 0, imm, a->msz, fn);
    tcg_temp_free_i64(tcg_ctx, imm);
    return true;
}